

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::activateFrameConstraint
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *newConstraintValue)

{
  char *pcVar1;
  char *pcVar2;
  MatrixView<const_double> local_118;
  Transform local_e8 [96];
  MatrixFixSize local_88 [128];
  
  if ((newConstraintValue->m_rows == 4) && (newConstraintValue->m_cols == 4)) {
    local_118.m_storage = newConstraintValue->m_storage;
    local_118.m_rows = 4;
    local_118.m_cols = 4;
    local_118.m_storageOrder = newConstraintValue->m_storageOrder;
    local_118.m_innerStride = newConstraintValue->m_innerStride;
    local_118.m_outerStride = newConstraintValue->m_outerStride;
    MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)local_88,&local_118);
    iDynTree::Transform::Transform(local_e8,local_88);
    pcVar2 = "";
    pcVar1 = "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics";
  }
  else {
    pcVar2 = "activateFrameConstraint";
    pcVar1 = "Wrong size in input constraintValue";
  }
  iDynTree::reportError("InverseKinematics",pcVar2,pcVar1);
  return false;
}

Assistant:

bool InverseKinematics::activateFrameConstraint(const std::string& frameName,
                                                    iDynTree::MatrixView<const double> newConstraintValue)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (newConstraintValue.rows() == expected_transform_rows)
            && (newConstraintValue.cols() == expected_transform_cols);
        if( !ok )
        {
            reportError("InverseKinematics","activateFrameConstraint","Wrong size in input constraintValue");
            return false;
        }

        return this->activateFrameConstraint(frameName, Transform(newConstraintValue));
    }